

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

int CVodeGetDky(void *cvode_mem,sunrealtype t,int k,N_Vector dky)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  char *msgfmt;
  int iVar9;
  double dVar10;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar9 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar8 = -0x15;
    iVar5 = 0x68e;
  }
  else if (dky == (N_Vector)0x0) {
    msgfmt = "dky = NULL illegal.";
    iVar9 = -0x1a;
    iVar8 = -0x1a;
    iVar5 = 0x697;
  }
  else {
    if (-1 < k) {
      uVar3 = *(uint *)((long)cvode_mem + 0x120);
      if (k <= (int)uVar3) {
        dVar1 = *(double *)((long)cvode_mem + 0x168);
        dVar2 = *(double *)((long)cvode_mem + 0x440);
        dVar10 = (ABS(dVar2) + ABS(dVar1)) * *(double *)((long)cvode_mem + 8) * 100.0;
        dVar10 = (double)(-(ulong)(dVar2 < 0.0) & (ulong)-dVar10 |
                         ~-(ulong)(dVar2 < 0.0) & (ulong)dVar10);
        if (0.0 < (t - (dVar10 + dVar1)) * (t - ((dVar1 - dVar2) - dVar10))) {
          cvProcessError((CVodeMem)cvode_mem,-0x19,0x6ac,"CVodeGetDky",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                         ,
                         "Illegal value for t.t = %.15g is not between tcur - hold = %.15g and tcur = %.15g"
                        );
          return -0x19;
        }
        dVar2 = *(double *)((long)cvode_mem + 0x140);
        uVar6 = (ulong)((uVar3 - k) + 1);
        uVar4 = 0;
        do {
          iVar5 = uVar3 - k;
          *(undefined8 *)((long)cvode_mem + uVar4 * 8 + 0x658) = 0x3ff0000000000000;
          dVar10 = 1.0;
          if (k != 0) {
            dVar10 = 1.0;
            uVar7 = uVar3;
            do {
              dVar10 = dVar10 * (double)(int)uVar7;
              uVar7 = uVar7 - 1;
            } while (iVar5 < (int)uVar7);
            *(double *)((long)cvode_mem + uVar4 * 8 + 0x658) = dVar10;
          }
          if (0 < iVar5) {
            iVar8 = 0;
            do {
              dVar10 = dVar10 * ((t - dVar1) / dVar2);
              iVar8 = iVar8 + 1;
            } while (iVar8 < iVar5);
            *(double *)((long)cvode_mem + uVar4 * 8 + 0x658) = dVar10;
          }
          *(undefined8 *)((long)cvode_mem + uVar4 * 8 + 0x6c0) =
               *(undefined8 *)((long)cvode_mem + (ulong)uVar3 * 8 + 0x60);
          uVar4 = uVar4 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar4 != uVar6);
        iVar5 = N_VLinearCombination(uVar6,(long)cvode_mem + 0x658,(long)cvode_mem + 0x6c0,dky);
        if (iVar5 != 0) {
          return -0x1c;
        }
        if (k == 0) {
          return 0;
        }
        SUNRpowerI(*(undefined8 *)((long)cvode_mem + 0x140),-k);
        N_VScale(dky,dky);
        return 0;
      }
    }
    msgfmt = "Illegal value for k.";
    iVar9 = -0x18;
    iVar8 = -0x18;
    iVar5 = 0x69f;
  }
  cvProcessError((CVodeMem)cvode_mem,iVar8,iVar5,"CVodeGetDky",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                 ,msgfmt);
  return iVar9;
}

Assistant:

int CVodeGetDky(void* cvode_mem, sunrealtype t, int k, N_Vector dky)
{
  sunrealtype s, r;
  sunrealtype tfuzz, tp, tn1;
  int i, j, nvec, ier;
  CVodeMem cv_mem;

  /* Check all inputs for legality */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  if (dky == NULL)
  {
    cvProcessError(cv_mem, CV_BAD_DKY, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_DKY);
  }

  if ((k < 0) || (k > cv_mem->cv_q))
  {
    cvProcessError(cv_mem, CV_BAD_K, __LINE__, __func__, __FILE__, MSGCV_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_K);
  }

  /* Allow for some slack */
  tfuzz = FUZZ_FACTOR * cv_mem->cv_uround *
          (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_hu));
  if (cv_mem->cv_hu < ZERO) { tfuzz = -tfuzz; }
  tp  = cv_mem->cv_tn - cv_mem->cv_hu - tfuzz;
  tn1 = cv_mem->cv_tn + tfuzz;
  if ((t - tp) * (t - tn1) > ZERO)
  {
    cvProcessError(cv_mem, CV_BAD_T, __LINE__, __func__, __FILE__, MSGCV_BAD_T,
                   t, cv_mem->cv_tn - cv_mem->cv_hu, cv_mem->cv_tn);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_T);
  }

  /* Sum the differentiated interpolating polynomial */
  nvec = 0;

  s = (t - cv_mem->cv_tn) / cv_mem->cv_h;
  for (j = cv_mem->cv_q; j >= k; j--)
  {
    cv_mem->cv_cvals[nvec] = ONE;
    for (i = j; i >= j - k + 1; i--) { cv_mem->cv_cvals[nvec] *= i; }
    for (i = 0; i < j - k; i++) { cv_mem->cv_cvals[nvec] *= s; }
    cv_mem->cv_Xvecs[nvec] = cv_mem->cv_zn[j];
    nvec += 1;
  }
  ier = N_VLinearCombination(nvec, cv_mem->cv_cvals, cv_mem->cv_Xvecs, dky);
  if (ier != CV_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_VECTOROP_ERR);
  }

  if (k == 0)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_SUCCESS);
  }
  r = SUNRpowerI(cv_mem->cv_h, -k);
  N_VScale(r, dky, dky);

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}